

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O2

void __thiscall MuxerManager::doMux(MuxerManager *this,string *outFileName,FileFactory *fileFactory)

{
  pointer pWVar1;
  int iVar2;
  BufferedFileWriter *pBVar3;
  iterator iVar4;
  MuxerManager *pMVar5;
  ostream *poVar6;
  WriterData *i;
  pointer data;
  AVPacket avPacket;
  AVPacket local_88;
  
  preinitMux(this,outFileName,fileFactory);
  pBVar3 = (BufferedFileWriter *)operator_new(0x130);
  BufferedFileWriter::BufferedFileWriter(pBVar3);
  this->m_fileWriter = pBVar3;
  local_88.flags = 0;
  local_88.data = (uint8_t *)0x0;
  local_88.size = 0;
  local_88.stream_index = 0;
  local_88.pts = 0;
  local_88.dts = 0;
  local_88.duration = 0;
  local_88.pos = 0;
  local_88.pcr = 0;
  local_88.codec = (BaseAbstractStreamReader *)0x0;
  local_88.codecID = 0;
  while( true ) {
    iVar2 = METADemuxer::readPacket(&this->m_metaDemuxer,&local_88);
    if (iVar2 == 1) break;
    if (this->m_cutStart < 1 || this->m_cutStart <= local_88.pts) {
      if (this->m_cutEnd <= local_88.pts && 0 < this->m_cutEnd) break;
      iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&(this->m_subStreamIndex)._M_t,&local_88.stream_index);
      pMVar5 = (MuxerManager *)&this->m_subMuxer;
      if ((_Rb_tree_header *)iVar4._M_node ==
          &(this->m_subStreamIndex)._M_t._M_impl.super__Rb_tree_header) {
        pMVar5 = this;
      }
      (*pMVar5->m_mainMuxer->_vptr_AbstractMuxer[7])(pMVar5->m_mainMuxer,&local_88);
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Flushing write buffer");
  std::endl<char,std::char_traits<char>>(poVar6);
  sLastMsg = true;
  if (this->m_subMuxer != (AbstractMuxer *)0x0) {
    (*this->m_subMuxer->_vptr_AbstractMuxer[3])();
  }
  (*this->m_mainMuxer->_vptr_AbstractMuxer[3])();
  pWVar1 = (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (data = (this->m_delayedData).super__Vector_base<WriterData,_std::allocator<WriterData>_>.
              _M_impl.super__Vector_impl_data._M_start; data != pWVar1; data = data + 1) {
    asyncWriteBlock(this,data);
  }
  waitForWriting(this);
  (*this->m_mainMuxer->_vptr_AbstractMuxer[4])();
  if (this->m_subMuxer != (AbstractMuxer *)0x0) {
    (*this->m_subMuxer->_vptr_AbstractMuxer[4])();
  }
  pBVar3 = this->m_fileWriter;
  if (pBVar3 != (BufferedFileWriter *)0x0) {
    BufferedFileWriter::~BufferedFileWriter(pBVar3);
  }
  operator_delete(pBVar3,0x130);
  this->m_fileWriter = (BufferedFileWriter *)0x0;
  return;
}

Assistant:

void MuxerManager::doMux(const string& outFileName, FileFactory* fileFactory)
{
    preinitMux(outFileName, fileFactory);

    m_fileWriter = new BufferedFileWriter();
    AVPacket avPacket;

    while (true)
    {
        const int avRez = m_metaDemuxer.readPacket(avPacket);

        if (avRez == BufferedReader::DATA_EOF)
            break;
        if (m_cutStart > 0)
        {
            if (avPacket.pts < m_cutStart)
                continue;
        }
        if (m_cutEnd > 0 && avPacket.pts >= m_cutEnd)
            break;

        if (m_subStreamIndex.find(avPacket.stream_index) != m_subStreamIndex.end())
            m_subMuxer->muxPacket(avPacket);
        else
            m_mainMuxer->muxPacket(avPacket);
    }

    LTRACE(LT_INFO, 2, "Flushing write buffer");

    if (m_subMuxer)
        m_subMuxer->doFlush();
    m_mainMuxer->doFlush();

    for (auto& i : m_delayedData) asyncWriteBlock(i);

    waitForWriting();

    m_mainMuxer->close();
    if (m_subMuxer)
        m_subMuxer->close();

    delete m_fileWriter;

    m_fileWriter = nullptr;
}